

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parse.cpp
# Opt level: O2

string * going_get_value_from_http_header
                   (string *__return_storage_ptr__,string *key,going_header *header)

{
  const_iterator cVar1;
  allocator<char> *__a;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if ((header->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    __a = &local_11;
  }
  else {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&header->_M_t,key);
    if ((_Rb_tree_header *)cVar1._M_node != &(header->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(cVar1._M_node + 2));
      return __return_storage_ptr__;
    }
    __a = &local_12;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",__a);
  return __return_storage_ptr__;
}

Assistant:

string going_get_value_from_http_header(const string& key, const going_header& header)
{
	if(header.empty()){
		return "";
	}
	going_header::const_iterator cit = header.find(key);
	if(cit == header.end())
		return "";

	return (*cit).second;
}